

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_count_overlappable_neighbors(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  BLOCK_SIZE *pBVar1;
  int iVar2;
  long in_RSI;
  MB_MODE_INFO *mbmi;
  void *in_stack_00000050;
  overlappable_nb_visitor_t in_stack_00000058;
  int in_stack_00000064;
  MACROBLOCKD *in_stack_00000068;
  AV1_COMMON *in_stack_00000070;
  
  pBVar1 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x1eb8);
  pBVar1[0x1a] = BLOCK_4X4;
  iVar2 = is_motion_variation_allowed_bsize(*pBVar1);
  if ((iVar2 != 0) &&
     (foreach_overlappable_nb_above
                (in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058,
                 in_stack_00000050), pBVar1[0x1a] == BLOCK_4X4)) {
    foreach_overlappable_nb_left
              (in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058,
               in_stack_00000050);
  }
  return;
}

Assistant:

void av1_count_overlappable_neighbors(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  mbmi->overlappable_neighbors = 0;

  if (!is_motion_variation_allowed_bsize(mbmi->bsize)) return;

  foreach_overlappable_nb_above(cm, xd, INT_MAX, increment_int_ptr,
                                &mbmi->overlappable_neighbors);
  if (mbmi->overlappable_neighbors) return;
  foreach_overlappable_nb_left(cm, xd, INT_MAX, increment_int_ptr,
                               &mbmi->overlappable_neighbors);
}